

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

void __thiscall DynamicHistogram<double>::~DynamicHistogram(DynamicHistogram<double> *this)

{
  ~DynamicHistogram(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

virtual
    ~DynamicHistogram()
    {
    }